

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O0

void __thiscall pele::physics::reactions::ReactorCvode::checkCvodeOptions(ReactorCvode *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  sunindextype *psVar6;
  sunindextype *psVar7;
  ulong uVar8;
  void *pvVar9;
  ostream *poVar10;
  Print *this_00;
  Print *msg;
  Print *this_01;
  long in_RDI;
  int j_2;
  int idx_2;
  int *idx_arr_2;
  int nbVals_2;
  int i_2;
  int j_1;
  int idx_1;
  int *idx_arr_1;
  int nbVals_1;
  int i_1;
  int j;
  int idx;
  int *idx_arr;
  int nbVals;
  int i;
  int counter;
  int *colIdx;
  int *rowCount;
  SUNMatrix PS;
  int nJdata_3;
  int HP_3;
  int ncells;
  int HP_2;
  int nJdata_2;
  int HP_1;
  int nJdata_1;
  int HP;
  int nJdata;
  string prec_type_str;
  int precond_type;
  int analytical_jacobian;
  int solve_type;
  ParmParse ppcv;
  string solve_type_str;
  SUNMatrix in_stack_ffffffffffffd5e8;
  Print *in_stack_ffffffffffffd5f0;
  SUNContext in_stack_ffffffffffffd5f8;
  ParmParse *in_stack_ffffffffffffd600;
  undefined8 in_stack_ffffffffffffd608;
  int *in_stack_ffffffffffffd610;
  ostream *in_stack_ffffffffffffd618;
  Print *in_stack_ffffffffffffd620;
  Print *in_stack_ffffffffffffd660;
  int in_stack_ffffffffffffd66c;
  string *in_stack_ffffffffffffd670;
  char *in_stack_ffffffffffffd678;
  ParmParse *in_stack_ffffffffffffd680;
  int in_stack_ffffffffffffd98c;
  int *in_stack_ffffffffffffd990;
  int *in_stack_ffffffffffffd998;
  int in_stack_ffffffffffffd9a4;
  int *in_stack_ffffffffffffd9a8;
  int in_stack_ffffffffffffd9b0;
  int in_stack_ffffffffffffd9b4;
  int *in_stack_ffffffffffffd9b8;
  int *in_stack_ffffffffffffd9c0;
  int *in_stack_ffffffffffffd9c8;
  int local_252c;
  int local_2528;
  int local_2514;
  int local_206c;
  int local_2068;
  int local_2054;
  int local_1bac;
  int local_1ba8;
  int local_1b90;
  allocator local_d59;
  string local_d58 [2776];
  int local_280;
  int local_27c;
  int local_278;
  allocator local_271;
  string local_270 [127];
  allocator local_1f1;
  string local_1f0 [32];
  undefined4 local_1d0;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  if (0 < *(int *)(in_RDI + 8)) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [30])in_stack_ffffffffffffd5e8);
    local_1d0 = 9;
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [2])in_stack_ffffffffffffd5e8);
    amrex::Print::~Print(in_stack_ffffffffffffd660);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"none",&local_1f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"cvode",&local_271);
  amrex::ParmParse::ParmParse(in_stack_ffffffffffffd600,(string *)in_stack_ffffffffffffd5f8);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  amrex::ParmParse::query
            (in_stack_ffffffffffffd680,in_stack_ffffffffffffd678,in_stack_ffffffffffffd670,
             in_stack_ffffffffffffd66c);
  local_278 = -1;
  local_27c = 0;
  local_280 = -1;
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffd5f0,(char *)in_stack_ffffffffffffd5e8);
  if (bVar4) {
    local_278 = 0;
    local_27c = 0;
    if (0 < *(int *)(in_RDI + 8)) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
      amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [39])in_stack_ffffffffffffd5e8);
      amrex::Print::~Print(in_stack_ffffffffffffd660);
    }
  }
  else {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffd5f0,(char *)in_stack_ffffffffffffd5e8);
    if (bVar4) {
      local_278 = 1;
      if (0 < *(int *)(in_RDI + 8)) {
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
        amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [68])in_stack_ffffffffffffd5e8)
        ;
        amrex::Print::~Print(in_stack_ffffffffffffd660);
      }
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffd5f0,(char *)in_stack_ffffffffffffd5e8);
      if (bVar4) {
        local_278 = 2;
        local_27c = 1;
        if (0 < *(int *)(in_RDI + 8)) {
          amrex::OutStream();
          amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
          amrex::Print::operator<<
                    (in_stack_ffffffffffffd5f0,(char (*) [61])in_stack_ffffffffffffd5e8);
          amrex::Print::~Print(in_stack_ffffffffffffd660);
        }
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffd5f0,(char *)in_stack_ffffffffffffd5e8);
        if (bVar4) {
          local_278 = 3;
          local_27c = 1;
          local_8 = "solver_type sparse_direct requires the KLU library";
          amrex::Abort_host((char *)in_stack_ffffffffffffd600);
          if (0 < *(int *)(in_RDI + 8)) {
            amrex::OutStream();
            amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
            amrex::Print::operator<<
                      (in_stack_ffffffffffffd5f0,(char (*) [66])in_stack_ffffffffffffd5e8);
            amrex::Print::~Print(in_stack_ffffffffffffd660);
          }
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffd5f0,(char *)in_stack_ffffffffffffd5e8);
          if (bVar4) {
            local_278 = 4;
            local_27c = 1;
            if (0 < *(int *)(in_RDI + 8)) {
              amrex::OutStream();
              amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
              amrex::Print::operator<<
                        (in_stack_ffffffffffffd5f0,(char (*) [69])in_stack_ffffffffffffd5e8);
              amrex::Print::~Print(in_stack_ffffffffffffd660);
            }
          }
          else {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffd5f0,(char *)in_stack_ffffffffffffd5e8);
            if (bVar4) {
              local_278 = 5;
              if (0 < *(int *)(in_RDI + 8)) {
                amrex::OutStream();
                amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
                amrex::Print::operator<<
                          (in_stack_ffffffffffffd5f0,(char (*) [34])in_stack_ffffffffffffd5e8);
                amrex::Print::~Print(in_stack_ffffffffffffd660);
              }
            }
            else {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffd5f0,(char *)in_stack_ffffffffffffd5e8
                                     );
              if (bVar4) {
                local_278 = 6;
                if (0 < *(int *)(in_RDI + 8)) {
                  amrex::OutStream();
                  amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
                  amrex::Print::operator<<
                            (in_stack_ffffffffffffd5f0,(char (*) [33])in_stack_ffffffffffffd5e8);
                  amrex::Print::~Print(in_stack_ffffffffffffd660);
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_d58,"none",&local_d59);
                std::allocator<char>::~allocator((allocator<char> *)&local_d59);
                amrex::ParmParse::query
                          (in_stack_ffffffffffffd680,in_stack_ffffffffffffd678,
                           in_stack_ffffffffffffd670,in_stack_ffffffffffffd66c);
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffd5f0,
                                        (char *)in_stack_ffffffffffffd5e8);
                if (bVar4) {
                  local_280 = 0;
                  amrex::OutStream();
                  amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
                  amrex::Print::operator<<
                            (in_stack_ffffffffffffd5f0,(char (*) [49])in_stack_ffffffffffffd5e8);
                  amrex::Print::~Print(in_stack_ffffffffffffd660);
                }
                else {
                  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffd5f0,
                                          (char *)in_stack_ffffffffffffd5e8);
                  if (bVar4) {
                    local_280 = 1;
                    local_10 = "precond_type sparse_simplified_AJacobian requires the KLU library";
                    amrex::Abort_host((char *)in_stack_ffffffffffffd600);
                    amrex::OutStream();
                    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
                    amrex::Print::operator<<
                              (in_stack_ffffffffffffd5f0,(char (*) [50])in_stack_ffffffffffffd5e8);
                    amrex::Print::~Print(in_stack_ffffffffffffd660);
                  }
                  else {
                    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_ffffffffffffd5f0,
                                            (char *)in_stack_ffffffffffffd5e8);
                    if (bVar4) {
                      local_280 = 2;
                      amrex::OutStream();
                      amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
                      amrex::Print::operator<<
                                (in_stack_ffffffffffffd5f0,(char (*) [50])in_stack_ffffffffffffd5e8)
                      ;
                      amrex::Print::~Print(in_stack_ffffffffffffd660);
                    }
                    else {
                      local_18 = 
                      "Wrong precond_type. Options are: \'dense_simplified_AJacobian\', \'sparse_simplified_AJacobian\', \'custom_simplified_AJacobian\'"
                      ;
                      amrex::Abort_host((char *)in_stack_ffffffffffffd600);
                    }
                  }
                }
                amrex::OutStream();
                amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
                amrex::Print::operator<<
                          (in_stack_ffffffffffffd5f0,(char (*) [2])in_stack_ffffffffffffd5e8);
                amrex::Print::~Print(in_stack_ffffffffffffd660);
                std::__cxx11::string::~string(local_d58);
              }
              else {
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffd5f0,
                                        (char *)in_stack_ffffffffffffd5e8);
                if (bVar4) {
                  local_278 = 7;
                }
                else {
                  local_20 = 
                  "Wrong solve_type. Options are: \'dense_direct\', denseAJ_direct\', \'sparse_direct\', \'custom_direct\', \'GMRES\', \'precGMRES\', \'fixed_point\'"
                  ;
                  amrex::Abort_host((char *)in_stack_ffffffffffffd600);
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_280 == 1) {
    SPARSITY_INFO_SYST_SIMPLIFIED(in_stack_ffffffffffffd998,in_stack_ffffffffffffd990);
    if (0 < *(int *)(in_RDI + 8)) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
      amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [68])in_stack_ffffffffffffd5e8);
      amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
      amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8);
      amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(double *)in_stack_ffffffffffffd5e8);
      amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8);
      amrex::Print::~Print(in_stack_ffffffffffffd660);
    }
  }
  else if ((local_280 == 2) &&
          (SPARSITY_INFO_SYST_SIMPLIFIED(in_stack_ffffffffffffd998,in_stack_ffffffffffffd990),
          0 < *(int *)(in_RDI + 8))) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [71])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(double *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8);
    amrex::Print::~Print(in_stack_ffffffffffffd660);
  }
  if (local_27c == 1) {
    if (local_278 == 4) {
      SPARSITY_INFO_SYST(in_stack_ffffffffffffd998,in_stack_ffffffffffffd990,
                         in_stack_ffffffffffffd98c);
      if (0 < *(int *)(in_RDI + 8)) {
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
        amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [63])in_stack_ffffffffffffd5e8)
        ;
        amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
        amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8)
        ;
        amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(double *)in_stack_ffffffffffffd5e8);
        amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8)
        ;
        amrex::Print::~Print(in_stack_ffffffffffffd660);
      }
    }
    else if (local_278 == 3) {
      local_28 = 
      "solver_type \'sparseDirect\' uses a sparse KLU matrix and requires the KLU library";
      amrex::Abort_host((char *)in_stack_ffffffffffffd600);
    }
  }
  if (local_278 == 7) {
    SPARSITY_INFO(in_stack_ffffffffffffd998,in_stack_ffffffffffffd990,in_stack_ffffffffffffd98c);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [36])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(double *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8);
    amrex::Print::~Print(in_stack_ffffffffffffd660);
    amrex::OpenMP::get_thread_num();
    amrex::sundials::The_Sundials_Context(0);
    sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c7c1c);
    SUNSparseMatrix((sunindextype)((ulong)in_stack_ffffffffffffd608 >> 0x20),
                    (sunindextype)in_stack_ffffffffffffd608,
                    (sunindextype)((ulong)in_stack_ffffffffffffd600 >> 0x20),
                    (int)in_stack_ffffffffffffd600,in_stack_ffffffffffffd5f8);
    psVar6 = SUNSparseMatrix_IndexPointers(in_stack_ffffffffffffd5e8);
    psVar7 = SUNSparseMatrix_IndexValues(in_stack_ffffffffffffd5e8);
    SPARSITY_PREPROC_CSR
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,in_stack_ffffffffffffd9b8,
               in_stack_ffffffffffffd9b4,in_stack_ffffffffffffd9b0);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [55])in_stack_ffffffffffffd5e8);
    amrex::Print::~Print(in_stack_ffffffffffffd660);
    for (local_1b90 = 0; local_1b90 < 10; local_1b90 = local_1b90 + 1) {
      iVar5 = psVar6[(long)local_1b90 + 1] - psVar6[local_1b90];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar5;
      uVar8 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      pvVar9 = operator_new__(uVar8);
      std::fill_n<int*,int,int>
                (in_stack_ffffffffffffd610,(int)((ulong)in_stack_ffffffffffffd608 >> 0x20),
                 (int *)in_stack_ffffffffffffd600);
      memcpy(pvVar9,psVar7 + psVar6[local_1b90],(long)iVar5 << 2);
      local_1ba8 = 0;
      for (local_1bac = 0; local_1bac < 10; local_1bac = local_1bac + 1) {
        if ((local_1bac == *(int *)((long)pvVar9 + (long)local_1ba8 * 4)) && (0 < iVar5)) {
          poVar10 = (ostream *)std::ostream::operator<<(&std::cout,1);
          std::operator<<(poVar10," ");
          local_1ba8 = local_1ba8 + 1;
        }
        else {
          poVar10 = (ostream *)std::ostream::operator<<(&std::cout,0);
          std::operator<<(poVar10," ");
        }
      }
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [12])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [34])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [12])in_stack_ffffffffffffd5e8);
    amrex::Print::~Print(in_stack_ffffffffffffd660);
    SPARSITY_INFO_SYST(in_stack_ffffffffffffd998,in_stack_ffffffffffffd990,in_stack_ffffffffffffd98c
                      );
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [36])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(double *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8);
    amrex::Print::~Print(in_stack_ffffffffffffd660);
    amrex::OpenMP::get_thread_num();
    amrex::sundials::The_Sundials_Context(0);
    sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c8192);
    SUNSparseMatrix((sunindextype)((ulong)in_stack_ffffffffffffd608 >> 0x20),
                    (sunindextype)in_stack_ffffffffffffd608,
                    (sunindextype)((ulong)in_stack_ffffffffffffd600 >> 0x20),
                    (int)in_stack_ffffffffffffd600,in_stack_ffffffffffffd5f8);
    psVar6 = SUNSparseMatrix_IndexPointers(in_stack_ffffffffffffd5e8);
    psVar7 = SUNSparseMatrix_IndexValues(in_stack_ffffffffffffd5e8);
    SPARSITY_PREPROC_SYST_CSR
              (in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c0,in_stack_ffffffffffffd9b8,
               in_stack_ffffffffffffd9b4,in_stack_ffffffffffffd9b0);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [55])in_stack_ffffffffffffd5e8);
    amrex::Print::~Print(in_stack_ffffffffffffd660);
    for (local_2054 = 0; local_2054 < 10; local_2054 = local_2054 + 1) {
      iVar5 = psVar6[(long)local_2054 + 1] - psVar6[local_2054];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)iVar5;
      uVar8 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      pvVar9 = operator_new__(uVar8);
      std::fill_n<int*,int,int>
                (in_stack_ffffffffffffd610,(int)((ulong)in_stack_ffffffffffffd608 >> 0x20),
                 (int *)in_stack_ffffffffffffd600);
      memcpy(pvVar9,psVar7 + (psVar6[local_2054] + -1),(long)iVar5 << 2);
      local_2068 = 0;
      for (local_206c = 0; local_206c < 10; local_206c = local_206c + 1) {
        if ((local_206c == *(int *)((long)pvVar9 + (long)local_2068 * 4) + -1) &&
           (0 < iVar5 - local_2068)) {
          poVar10 = (ostream *)std::ostream::operator<<(&std::cout,1);
          std::operator<<(poVar10," ");
          local_2068 = local_2068 + 1;
        }
        else {
          poVar10 = (ostream *)std::ostream::operator<<(&std::cout,0);
          std::operator<<(poVar10," ");
        }
      }
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [12])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [34])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [12])in_stack_ffffffffffffd5e8);
    amrex::Print::~Print(in_stack_ffffffffffffd660);
    SPARSITY_INFO_SYST_SIMPLIFIED(in_stack_ffffffffffffd998,in_stack_ffffffffffffd990);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [60])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(double *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [20])in_stack_ffffffffffffd5e8);
    amrex::Print::~Print(in_stack_ffffffffffffd660);
    amrex::OpenMP::get_thread_num();
    this_00 = (Print *)amrex::sundials::The_Sundials_Context(0);
    sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c8739);
    SUNSparseMatrix((sunindextype)((ulong)in_stack_ffffffffffffd608 >> 0x20),
                    (sunindextype)in_stack_ffffffffffffd608,
                    (sunindextype)((ulong)in_stack_ffffffffffffd600 >> 0x20),
                    (int)in_stack_ffffffffffffd600,in_stack_ffffffffffffd5f8);
    psVar6 = SUNSparseMatrix_IndexPointers(in_stack_ffffffffffffd5e8);
    psVar7 = SUNSparseMatrix_IndexValues(in_stack_ffffffffffffd5e8);
    SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR
              (in_stack_ffffffffffffd9b8,
               (int *)CONCAT44(in_stack_ffffffffffffd9b4,in_stack_ffffffffffffd9b0),
               in_stack_ffffffffffffd9a8,in_stack_ffffffffffffd9a4);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [66])in_stack_ffffffffffffd5e8);
    amrex::Print::~Print(this_00);
    for (local_2514 = 0; local_2514 < 10; local_2514 = local_2514 + 1) {
      iVar5 = psVar6[(long)local_2514 + 1] - psVar6[local_2514];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)iVar5;
      uVar8 = SUB168(auVar3 * ZEXT816(4),0);
      if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      in_stack_ffffffffffffd618 = (ostream *)operator_new__(uVar8);
      std::fill_n<int*,int,int>
                (in_stack_ffffffffffffd610,(int)((ulong)in_stack_ffffffffffffd608 >> 0x20),
                 (int *)in_stack_ffffffffffffd600);
      memcpy(in_stack_ffffffffffffd618,psVar7 + (psVar6[local_2514] + -1),(long)iVar5 << 2);
      local_2528 = 0;
      for (local_252c = 0; local_252c < 10; local_252c = local_252c + 1) {
        if ((local_252c == *(int *)(in_stack_ffffffffffffd618 + (long)local_2528 * 4) + -1) &&
           (0 < iVar5 - local_2528)) {
          poVar10 = (ostream *)std::ostream::operator<<(&std::cout,1);
          std::operator<<(poVar10," ");
          local_2528 = local_2528 + 1;
        }
        else {
          in_stack_ffffffffffffd620 = (Print *)std::ostream::operator<<(&std::cout,0);
          std::operator<<((ostream *)in_stack_ffffffffffffd620," ");
        }
      }
      if (in_stack_ffffffffffffd618 != (ostream *)0x0) {
        operator_delete__(in_stack_ffffffffffffd618);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [12])in_stack_ffffffffffffd5e8);
    msg = amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(char (*) [34])in_stack_ffffffffffffd5e8);
    this_01 = amrex::Print::operator<<(in_stack_ffffffffffffd5f0,(int *)in_stack_ffffffffffffd5e8);
    amrex::Print::operator<<(this_01,(char (*) [12])in_stack_ffffffffffffd5e8);
    amrex::Print::~Print(this_00);
    local_30 = "Chemistry sparsity pattern dumped -> exiting now !";
    amrex::Abort_host((char *)msg);
  }
  amrex::ParmParse::~ParmParse((ParmParse *)0x1c8ba5);
  std::__cxx11::string::~string(local_1f0);
  return;
}

Assistant:

void
ReactorCvode::checkCvodeOptions() const
{
  if (verbose > 0) {
    amrex::Print() << "Number of species in mech is " << NUM_SPECIES << "\n";
  }

  std::string solve_type_str = "none";
  amrex::ParmParse ppcv("cvode");
  ppcv.query("solve_type", solve_type_str);
  int solve_type = -1;
  int analytical_jacobian = 0;
  int precond_type = -1;

#ifdef AMREX_USE_GPU
  if (solve_type_str == "fixed_point") {
    solve_type = cvode::fixedPoint;
    analytical_jacobian = 0;
    if (verbose > 0)
      amrex::Print() << " Using a fixed-point nonlinear solver\n";
  } else if (solve_type_str == "sparse_direct") {
    solve_type = cvode::sparseDirect;
    analytical_jacobian = 1;
#ifdef AMREX_USE_CUDA
    if (verbose > 0)
      amrex::Print()
        << " Using a cuSparse direct linear solve with analytical Jacobian\n";
#else
    amrex::Abort("solve_type 'sparse_direct' only available with CUDA");
#endif
  } else if (solve_type_str == "custom_direct") {
    solve_type = cvode::customDirect;
    analytical_jacobian = 1;
#ifdef AMREX_USE_CUDA
    if (verbose > 0)
      amrex::Print()
        << " Using a custom direct linear solve with analytical Jacobian\n";
#else
    amrex::Abort("solve_type 'custom_direct' only available with CUDA");
#endif
  } else if (solve_type_str == "magma_direct") {
    solve_type = cvode::magmaDirect;
    analytical_jacobian = 1;
#ifdef PELE_USE_MAGMA
    if (verbose > 0)
      amrex::Print() << " Using MAGMA direct linear solve\n";
#else
    amrex::Abort(
      "solve_type 'magma_direct' only available with if PELE_USE_MAGMA true");
#endif
  } else if (solve_type_str == "GMRES") {
    solve_type = cvode::GMRES;
    if (verbose > 0)
      amrex::Print() << " Using a JFNK GMRES linear solve\n";
  } else if (solve_type_str == "precGMRES") {
    solve_type = cvode::precGMRES;
    if (verbose > 0)
      amrex::Print() << " Using a JFNK GMRES linear solve";
    std::string prec_type_str = "cuSparse_simplified_AJacobian";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "cuSparse_simplified_AJacobian") {
      precond_type = cvode::sparseSimpleAJac;
#ifdef AMREX_USE_CUDA
      amrex::Print() << " with a cuSparse simplified AJ-based preconditioner";
#else
      amrex::Abort(
        "precond_type 'cuSparse_simplified_AJacobian' only available with "
        "CUDA");
#endif
    } else {
      amrex::Abort(
        "Wrong precond_type. Only option is: 'cuSparse_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'sparse_direct', 'custom_direct', "
      "'GMRES', 'precGMRES', 'fixed_point'");
  }

#else
  if (solve_type_str == "fixed_point") {
    solve_type = cvode::fixedPoint;
    analytical_jacobian = 0;
    if (verbose > 0)
      amrex::Print() << " Using a fixed-point nonlinear solver\n";
  } else if (solve_type_str == "dense_direct") {
    solve_type = cvode::denseFDDirect;
    if (verbose > 0) {
      amrex::Print()
        << " Using a dense direct linear solve with Finite Difference "
           "Jacobian\n";
    }
  } else if (solve_type_str == "denseAJ_direct") {
    solve_type = cvode::denseDirect;
    analytical_jacobian = 1;
    if (verbose > 0) {
      amrex::Print()
        << " Using a dense direct linear solve with Analytical Jacobian\n";
    }
  } else if (solve_type_str == "sparse_direct") {
    solve_type = cvode::sparseDirect;
    analytical_jacobian = 1;
#ifndef PELE_USE_KLU
    amrex::Abort("solver_type sparse_direct requires the KLU library");
#endif
    if (verbose > 0) {
      amrex::Print()
        << " Using a sparse direct linear solve with KLU Analytical Jacobian\n";
    }
  } else if (solve_type_str == "custom_direct") {
    solve_type = cvode::customDirect;
    analytical_jacobian = 1;
    if (verbose > 0) {
      amrex::Print()
        << " Using a sparse custom direct linear solve with Analytical "
           "Jacobian\n";
    }
  } else if (solve_type_str == "GMRES") {
    solve_type = cvode::GMRES;
    if (verbose > 0) {
      amrex::Print() << " Using a JFNK GMRES linear solve\n";
    }
  } else if (solve_type_str == "precGMRES") {
    solve_type = cvode::precGMRES;
    if (verbose > 0) {
      amrex::Print() << " Using a JFNK GMRES linear solve";
    }
    std::string prec_type_str = "none";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "dense_simplified_AJacobian") {
      precond_type = cvode::denseSimpleAJac;
      amrex::Print() << " with a dense simplified AJ-based preconditioner";
    } else if (prec_type_str == "sparse_simplified_AJacobian") {
      precond_type = cvode::sparseSimpleAJac;
#ifndef PELE_USE_KLU
      amrex::Abort(
        "precond_type sparse_simplified_AJacobian requires the KLU library");
#endif
      amrex::Print() << " with a sparse simplified AJ-based preconditioner";
    } else if (prec_type_str == "custom_simplified_AJacobian") {
      precond_type = cvode::customSimpleAJac;
      amrex::Print() << " with a custom simplified AJ-based preconditioner";
    } else {
      amrex::Abort(
        "Wrong precond_type. Options are: 'dense_simplified_AJacobian', "
        "'sparse_simplified_AJacobian', 'custom_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else if (solve_type_str == "diagnostic") {
    solve_type = cvode::hackDumpSparsePattern;
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'dense_direct', denseAJ_direct', "
      "'sparse_direct', 'custom_direct', 'GMRES', 'precGMRES', 'fixed_point'");
  }
#endif

  // Print additionnal information
  if (precond_type == cvode::sparseSimpleAJac) {
    int nJdata;
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
    // Simplified AJ precond data
#ifdef AMREX_USE_GPU
#if defined(AMREX_USE_CUDA)
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    if (verbose > 0) {
      amrex::Print()
        << "--> cuSparse AJ based matrix Preconditioner -- non zero entries: "
        << nJdata << ", which represents "
        << static_cast<amrex::Real>(nJdata) /
             static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
             100.0
        << " % fill-in pattern\n";
    }
#elif defined(AMREX_USE_HIP)
    amrex::Abort(
      "\n--> precond_type sparse simplified_AJacobian not available with "
      "HIP \n");
#elif defined(AMREX_USE_DPCPP)
    amrex::Abort(
      "\n--> precond_type sparse simplified_AJacobian not available with "
      "DPCPP \n");
#endif

#else
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    if (verbose > 0) {
      amrex::Print()
        << "--> KLU sparse AJ based matrix Preconditioner -- non zero entries: "
        << nJdata << ", which represents "
        << static_cast<amrex::Real>(nJdata) /
             static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
             100.0
        << " % fill-in pattern\n";
    }
#endif
#ifndef AMREX_USE_GPU
  } else if (precond_type == cvode::customSimpleAJac) {
    int nJdata;
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
    // Simplified AJ precond data
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    if (verbose > 0) {
      amrex::Print()
        << "--> custom sparse AJ based matrix Preconditioner -- non zero "
           "entries: "
        << nJdata << ", which represents "
        << static_cast<amrex::Real>(nJdata) /
             static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
             100.0
        << " % fill-in pattern\n";
    }
#endif
  }

  if (analytical_jacobian == 1) {
    int nJdata;
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
    int ncells = 1; // Print the pattern of the diagonal block. ncells will
                    // actually vary on GPU.
#ifdef AMREX_USE_GPU
    if (solve_type == cvode::sparseDirect) {
#if defined(AMREX_USE_CUDA)
      SPARSITY_INFO_SYST(&nJdata, &HP, ncells);
      if (verbose > 0) {
        amrex::Print()
          << "--> cuSparse based matrix Solver -- non zero entries: " << nJdata
          << ", which represents "
          << static_cast<amrex::Real>(nJdata) /
               static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
               100.0
          << " % fill-in pattern\n";
      }
#elif defined(AMREX_USE_HIP)
      amrex::Abort("\n--> Analytical Jacobian not available with HIP. Change "
                   "solve_type.\n");
#elif defined(AMREX_USE_DPCPP)
      amrex::Abort("\n--> Analytical Jacobian not available with DPCPP. Change "
                   "solve_type.\n");
#endif
    }

#else
    if (solve_type == cvode::customDirect) {
      SPARSITY_INFO_SYST(&nJdata, &HP, ncells);
      if (verbose > 0) {
        amrex::Print()
          << "--> sparse AJ-based matrix custom Solver -- non zero entries: "
          << nJdata << ", which represents "
          << static_cast<amrex::Real>(nJdata) /
               static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
               100.0
          << " % fill-in pattern\n";
      }
    } else if (solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
      SPARSITY_INFO(&nJdata, &HP, ncells);
      if (verbose > 0) {
        amrex::Print()
          << "--> KLU sparse AJ-based matrix Solver -- non zero entries: "
          << nJdata << ", which represents "
          << static_cast<amrex::Real>(nJdata) /
               static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
               100.0
          << " % fill-in pattern\n";
      }
#else
      amrex::Abort(
        "solver_type 'sparseDirect' uses a sparse KLU matrix and requires "
        "the KLU library");
#endif
    }
#endif
  }

#ifndef AMREX_USE_GPU
  if (solve_type == cvode::hackDumpSparsePattern) {
    // This is a diagnostic option -> dump sparsity pattern and abort.
    // Reactor type
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);

    // CHEMISTRY JAC
    int nJdata = 0;
    SPARSITY_INFO(&nJdata, &HP, 1);
    amrex::Print() << "--> Chem. Jac -- non zero entries: " << nJdata
                   << ", which represents "
                   << static_cast<amrex::Real>(nJdata) /
                        static_cast<amrex::Real>(
                          (NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
                        100.0
                   << " % fill-in pattern\n";
    SUNMatrix PS;
    PS = SUNSparseMatrix(
      (NUM_SPECIES + 1), (NUM_SPECIES + 1), nJdata, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    auto* rowCount = static_cast<int*>(SUNSparseMatrix_IndexPointers(PS));
    auto* colIdx = static_cast<int*>(SUNSparseMatrix_IndexValues(PS));
    SPARSITY_PREPROC_CSR(colIdx, rowCount, &HP, 1, 0);
    amrex::Print()
      << "\n\n *** Treating CHEM Jac (CSR symbolic analysis)*** \n\n";
    int counter = 0;
    for (int i = 0; i < NUM_SPECIES + 1; i++) {
      int nbVals = rowCount[i + 1] - rowCount[i];
      int* idx_arr = new int[nbVals];
      std::fill_n(idx_arr, nbVals, -1);
      std::memcpy(idx_arr, colIdx + rowCount[i], nbVals * sizeof(int));
      int idx = 0;
      for (int j = 0; j < NUM_SPECIES + 1; j++) {
        if ((j == idx_arr[idx]) && (nbVals > 0)) {
          std::cout << 1 << " ";
          idx = idx + 1;
          counter = counter + 1;
        } else {
          std::cout << 0 << " ";
        }
      }
      delete[] idx_arr;
      std::cout << std::endl;
    }
    amrex::Print() << " There was " << counter
                   << " non zero elems (compared to the " << nJdata
                   << " we need) \n";

    // SYST JAC
    SPARSITY_INFO_SYST(&nJdata, &HP, 1);
    amrex::Print() << "--> Syst. Jac -- non zero entries: " << nJdata
                   << ", which represents "
                   << static_cast<amrex::Real>(nJdata) /
                        static_cast<amrex::Real>(
                          (NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
                        100.0
                   << " % fill-in pattern\n";
    PS = SUNSparseMatrix(
      (NUM_SPECIES + 1), (NUM_SPECIES + 1), nJdata, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    rowCount = static_cast<int*>(SUNSparseMatrix_IndexPointers(PS));
    colIdx = static_cast<int*>(SUNSparseMatrix_IndexValues(PS));
    SPARSITY_PREPROC_SYST_CSR(colIdx, rowCount, &HP, 1, 1);
    amrex::Print()
      << "\n\n *** Treating SYST Jac (CSR symbolic analysis)*** \n\n";
    counter = 0;
    for (int i = 0; i < NUM_SPECIES + 1; i++) {
      int nbVals = rowCount[i + 1] - rowCount[i];
      int* idx_arr = new int[nbVals];
      std::fill_n(idx_arr, nbVals, -1);
      std::memcpy(idx_arr, colIdx + (rowCount[i] - 1), nbVals * sizeof(int));
      int idx = 0;
      for (int j = 0; j < NUM_SPECIES + 1; j++) {
        if ((j == idx_arr[idx] - 1) && ((nbVals - idx) > 0)) {
          std::cout << 1 << " ";
          idx = idx + 1;
          counter = counter + 1;
        } else {
          std::cout << 0 << " ";
        }
      }
      delete[] idx_arr;
      std::cout << std::endl;
    }
    amrex::Print() << " There was " << counter
                   << " non zero elems (compared to the " << nJdata
                   << " we need) \n";

    // SYST JAC SIMPLIFIED
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    amrex::Print()
      << "--> Simplified Syst Jac (for Precond) -- non zero entries: " << nJdata
      << ", which represents "
      << static_cast<amrex::Real>(nJdata) /
           static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
           100.0
      << " % fill-in pattern\n";
    PS = SUNSparseMatrix(
      (NUM_SPECIES + 1), (NUM_SPECIES + 1), nJdata, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    rowCount = static_cast<int*>(SUNSparseMatrix_IndexPointers(PS));
    colIdx = static_cast<int*>(SUNSparseMatrix_IndexValues(PS));
    SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(colIdx, rowCount, &HP, 1);
    amrex::Print() << "\n\n *** Treating simplified SYST Jac (CSR symbolic "
                      "analysis)*** \n\n";
    counter = 0;
    for (int i = 0; i < NUM_SPECIES + 1; i++) {
      int nbVals = rowCount[i + 1] - rowCount[i];
      int* idx_arr = new int[nbVals];
      std::fill_n(idx_arr, nbVals, -1);
      std::memcpy(idx_arr, colIdx + (rowCount[i] - 1), nbVals * sizeof(int));
      int idx = 0;
      for (int j = 0; j < NUM_SPECIES + 1; j++) {
        if ((j == idx_arr[idx] - 1) && ((nbVals - idx) > 0)) {
          std::cout << 1 << " ";
          idx = idx + 1;
          counter = counter + 1;
        } else {
          std::cout << 0 << " ";
        }
      }
      delete[] idx_arr;
      std::cout << std::endl;
    }
    amrex::Print() << " There was " << counter
                   << " non zero elems (compared to the " << nJdata
                   << " we need) \n";

    amrex::Abort("Chemistry sparsity pattern dumped -> exiting now !");
  }
#endif
}